

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded.hpp
# Opt level: O0

guarded<std::pair<bool,_bool>,_std::mutex> * __thiscall
gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
          (guarded<std::pair<bool,_bool>,_std::mutex> *this,pair<bool,_bool> *newObj)

{
  type in_RSI;
  guarded<std::pair<bool,_bool>,_std::mutex> *in_RDI;
  lock_guard<std::mutex> glock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
  CLI::std::pair<bool,_bool>::operator=(&in_RDI->m_obj,in_RSI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x47c3ff);
  return in_RDI;
}

Assistant:

guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }